

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::insertSpacerItem(QBoxLayout *this,int index,QSpacerItem *spacerItem)

{
  QBoxLayoutPrivate *this_00;
  int iVar1;
  parameter_type t;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar1 = QBoxLayoutPrivate::validateIndex(this_00,index);
  t = (parameter_type)operator_new(0x10);
  t->item = &spacerItem->super_QLayoutItem;
  t->stretch = 0;
  t->magic = true;
  QList<QBoxLayoutItem_*>::insert(&this_00->list,(long)iVar1,t);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QBoxLayout::insertSpacerItem(int index, QSpacerItem *spacerItem)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(spacerItem);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}